

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall
Timer::addTimer(Timer *this,TimerListener *listener,uint32_t msecs,uint32_t private_data)

{
  AutoLock _auto_lock_;
  AutoLock local_60;
  TimerNode local_48;
  
  AutoLock::AutoLock(&local_60,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xf8);
  if (listener != (TimerListener *)0x0) {
    local_48.mEvent.mObj = (Event *)0x0;
    local_48.mDispatcher = (IEventDispatcher *)0x0;
    local_48.mTick = ((msecs + this->mMsPerTick) - 1) / (uint)this->mMsPerTick + this->mTicks;
    local_48.mRepeatMS = 0;
    local_48.mRemainingMS = 0;
    local_48.mListener = listener;
    local_48.mPrivateData = private_data;
    addTimerNode(this,&local_48);
    SmartPtr<Event>::~SmartPtr(&local_48.mEvent);
    AutoLock::~AutoLock(&local_60);
    return;
  }
  abort();
}

Assistant:

void Timer::addTimer( TimerListener *listener,
					  uint32_t msecs,
					  uint32_t private_data )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mMutex );

	if (listener == NULL) abort();

	// Calculate the timeout time in ticks
	uint32_t ticks = ( msecs +  mMsPerTick - 1 ) / mMsPerTick;
	
	// Initialize new timer node
	TimerNode timer;
	timer.mEvent = NULL;
	timer.mDispatcher = NULL;
	timer.mPrivateData = private_data;
	timer.mListener = listener;
	timer.mTick = mTicks + ticks;
	timer.mRepeatMS = 0;
	timer.mRemainingMS = 0;	

	LOG( "timer at %d ticks", timer.mTick );

	addTimerNode( timer );
}